

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minShortLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *sel,int leave,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *maxabs)

{
  double dVar1;
  bool bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  fpclass_type fVar4;
  int32_t iVar5;
  int iVar6;
  pointer pnVar7;
  long lVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *v;
  byte bVar16;
  ulong uVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  shortval;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar16 = 0;
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar17 = -(ulong)(dVar1 == 1.0);
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,
             (double)(~uVar17 & (ulong)(dVar1 * 1e-05) | uVar17 & 0x3ee4f8b588e368f1));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pnVar7 = (((this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver)->theFvec->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = pnVar7[leave].m_backend.exp;
  bVar2 = pnVar7[leave].m_backend.neg;
  fVar4 = pnVar7[leave].m_backend.fpclass;
  iVar5 = pnVar7[leave].m_backend.prec_elem;
  memmove(sel,pnVar7 + leave,0x70);
  (sel->m_backend).exp = iVar6;
  (sel->m_backend).neg = bVar2;
  (sel->m_backend).fpclass = fVar4;
  (sel->m_backend).prec_elem = iVar5;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  if (&local_138 != &maxabs->m_backend) {
    pnVar10 = maxabs;
    pcVar13 = &local_138;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] =
           (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    local_138.exp = (maxabs->m_backend).exp;
    local_138.neg = (maxabs->m_backend).neg;
    local_138.fpclass = (maxabs->m_backend).fpclass;
    local_138.prec_elem = (maxabs->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_138,&local_b8);
  if ((((sel->m_backend).fpclass == cpp_dec_float_NaN) || (local_138.fpclass == cpp_dec_float_NaN))
     || (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&sel->m_backend,&local_138), iVar6 < 1)) {
    local_138.data._M_elems[0] = (maxabs->m_backend).data._M_elems[0];
    iVar6 = (maxabs->m_backend).exp;
    bVar2 = (maxabs->m_backend).neg;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.data._M_elems[1] = 0;
    puVar11 = (maxabs->m_backend).data._M_elems + 1;
    puVar14 = local_138.data._M_elems + 1;
    for (lVar8 = 0x1b; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar14 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
      puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
    }
    local_138.fpclass = (maxabs->m_backend).fpclass;
    local_138.prec_elem = (maxabs->m_backend).prec_elem;
    local_138.neg =
         (bool)((local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite) ^
               bVar2);
    local_138.exp = iVar6;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_138,&local_b8);
    if ((((sel->m_backend).fpclass == cpp_dec_float_NaN) || (local_138.fpclass == cpp_dec_float_NaN)
        ) || (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&sel->m_backend,&local_138), -1 < iVar6)) {
      return false;
    }
    pSVar9 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar7 = (pSVar9->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pSVar9 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar7 = (pSVar9->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pcVar13 = &pnVar7[leave].m_backend;
  v = &(pSVar9->theFvec->
       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start[leave].m_backend;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x1c;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  if (&local_1b8 == v) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_1b8,pcVar13);
    if (local_1b8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite) {
      local_1b8.neg = (bool)(local_1b8.neg ^ 1);
    }
  }
  else {
    if (&local_1b8 != pcVar13) {
      pcVar12 = pcVar13;
      pcVar15 = &local_1b8;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar16 * -8 + 4);
      }
      local_1b8.exp = pcVar13->exp;
      local_1b8.neg = pcVar13->neg;
      local_1b8.fpclass = pcVar13->fpclass;
      local_1b8.prec_elem = pcVar13->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_1b8,v);
  }
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_138,&local_1b8,&sel->m_backend);
  pcVar13 = &local_138;
  pnVar10 = sel;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar16 * -8 + 4);
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
  }
  (sel->m_backend).exp = local_138.exp;
  (sel->m_backend).neg = local_138.neg;
  (sel->m_backend).fpclass = local_138.fpclass;
  (sel->m_backend).prec_elem = local_138.prec_elem;
  return true;
}

Assistant:

bool SPxFastRT<R>::minShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}